

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

longlong kj::anon_unknown_39::parseSigned(StringPtr *s,longlong min,longlong max)

{
  char *__nptr;
  int *piVar1;
  longlong lVar2;
  int __base;
  longlong value;
  char *endPtr;
  char *local_30;
  
  if ((s->content).size_ < 2) {
    _GLOBAL__N_1::parseSigned((_GLOBAL__N_1 *)s);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    __nptr = (s->content).ptr;
    __base = 10;
    if (__nptr[*__nptr == '-'] == '0') {
      __base = 10;
      if ((__nptr[(ulong)(*__nptr == '-') + 1] & 0xdfU) == 0x58) {
        __base = 0x10;
      }
    }
    lVar2 = strtoll(__nptr,&local_30,__base);
    if (local_30 == (s->content).ptr + ((s->content).size_ - 1)) {
      if (*piVar1 == 0x22) {
        _GLOBAL__N_1::parseSigned((_GLOBAL__N_1 *)s);
      }
      else {
        if ((min <= lVar2) && (lVar2 <= max)) {
          return lVar2;
        }
        _GLOBAL__N_1::parseSigned();
      }
    }
    else {
      _GLOBAL__N_1::parseSigned((_GLOBAL__N_1 *)s);
    }
  }
  return 0;
}

Assistant:

long long parseSigned(const StringPtr& s, long long min, long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value >= min && value <= max, "Value out-of-range", value, min, max) { return 0; }
  return value;
}